

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_inexact_sqrt(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  long lVar1;
  sexp psVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  undefined8 extraout_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_40;
  sexp_gc_var_t local_38;
  double local_28;
  undefined8 uStack_20;
  
  local_40 = (sexp)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  lVar1 = (long)z >> 1;
  if ((((ulong)z & 3) == 0) && (z->tag == 0xb)) {
    local_28 = (z->value).flonum;
    in_XMM1_Qb = 0;
  }
  else if (((ulong)z & 1) == 0) {
    if (((ulong)z & 3) != 0) {
LAB_00129a1c:
      psVar2 = sexp_type_exception(ctx,self,3,z);
      return psVar2;
    }
    if (z->tag == 0xe) {
      psVar2 = sexp_complex_sqrt(ctx,z);
      psVar2 = sexp_complex_normalize(psVar2);
      return psVar2;
    }
    if (z->tag != 0xd) goto LAB_00129a1c;
    local_28 = sexp_ratio_to_double(ctx,z);
    in_XMM1_Qb = extraout_XMM0_Qb;
  }
  else {
    local_28 = (double)lVar1;
  }
  dVar5 = -local_28;
  if (-local_28 <= local_28) {
    dVar5 = local_28;
  }
  local_38.var = &local_40;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  uStack_20 = in_XMM1_Qb;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  if (((ulong)z & 1) != 0) {
    uVar4 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    lVar3 = -lVar1;
    if (0 < lVar1) {
      lVar3 = lVar1;
    }
    if (uVar4 * uVar4 - lVar3 == 0) {
      dVar5 = round(dVar5);
      local_40 = (sexp)((long)dVar5 * 2 + 1);
      goto LAB_00129ae3;
    }
  }
  local_40 = sexp_make_flonum(ctx,dVar5);
LAB_00129ae3:
  if (local_28 < 0.0) {
    local_40 = sexp_make_complex(ctx,(sexp)&DAT_00000001,local_40);
  }
  (ctx->value).context.saves = local_38.next;
  return local_40;
}

Assistant:

sexp sexp_inexact_sqrt (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
#if SEXP_USE_COMPLEX
  int negativep = 0;
#endif
  double d, r;
  sexp_gc_var1(res);
  if (sexp_flonump(z))
    d = sexp_flonum_value(z);
  else if (sexp_fixnump(z))
    d = (double)sexp_unbox_fixnum(z); /* may be larger or smaller than z */
  maybe_convert_ratio(ctx, z)         /* TODO: add ratio sqrt */
  maybe_convert_complex(z, sexp_complex_sqrt)
  else
    return sexp_type_exception(ctx, self, SEXP_NUMBER, z);
#if SEXP_USE_COMPLEX
  if (d < 0) {
    negativep = 1;
    d = -d;
  }
#endif
  sexp_gc_preserve1(ctx, res);
  r = sqrt(d);
  if (sexp_fixnump(z)
      && (((sexp_uint_t)r*(sexp_uint_t)r)==labs(sexp_unbox_fixnum(z))))
    res = sexp_make_fixnum(round(r));
  else
    res = sexp_make_flonum(ctx, r);
#if SEXP_USE_COMPLEX
  if (negativep)
    res = sexp_make_complex(ctx, SEXP_ZERO, res);
#endif
  sexp_gc_release1(ctx);
  return res;
}